

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

Error llvm::createStringError<int>(error_code EC,char *Fmt,int *Vals)

{
  string *Args;
  llvm *this;
  int *in_R8;
  format_object<int> local_a8;
  undefined1 local_80 [8];
  raw_string_ostream Stream;
  string Buffer;
  int *Vals_local;
  char *Fmt_local;
  error_code EC_local;
  
  this = EC._0_8_;
  Fmt_local._0_4_ = EC._M_cat._0_4_;
  EC_local._0_8_ = Fmt;
  EC_local._M_cat = (error_category *)this;
  std::__cxx11::string::string((string *)&Stream.OS);
  raw_string_ostream::raw_string_ostream((raw_string_ostream *)local_80,(string *)&Stream.OS);
  format<int>(&local_a8,(char *)Vals,in_R8);
  raw_ostream::operator<<((raw_ostream *)local_80,&local_a8.super_format_object_base);
  Args = raw_string_ostream::str_abi_cxx11_((raw_string_ostream *)local_80);
  make_error<llvm::StringError,std::__cxx11::string&,std::error_code&>
            (this,Args,(error_code *)&Fmt_local);
  raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_80);
  std::__cxx11::string::~string((string *)&Stream.OS);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

inline Error createStringError(std::error_code EC, char const *Fmt,
                               const Ts &... Vals) {
  std::string Buffer;
  raw_string_ostream Stream(Buffer);
  Stream << format(Fmt, Vals...);
  return make_error<StringError>(Stream.str(), EC);
}